

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_any(lysp_yang_ctx *ctx,ly_stmt any_kw,lysp_node *parent,lysp_node **siblings)

{
  lysp_node *plVar1;
  uint16_t uVar2;
  LY_ERR LVar3;
  char *pcVar4;
  char *pcVar5;
  ly_ctx *local_f0;
  ly_ctx *local_d8;
  char *local_d0;
  ly_ctx *local_c0;
  ly_ctx *local_b8;
  ly_ctx *local_b0;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  long *plStack_78;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  lysp_node *plStack_58;
  ly_stmt kw;
  lysp_node_anydata *any;
  size_t word_len;
  char *word;
  char *buf;
  lysp_node **pplStack_30;
  LY_ERR ret;
  lysp_node **siblings_local;
  lysp_node *parent_local;
  lysp_yang_ctx *plStack_18;
  ly_stmt any_kw_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_30 = siblings;
  siblings_local = &parent->parent;
  parent_local._4_4_ = any_kw;
  plStack_18 = ctx;
  plStack_58 = (lysp_node *)calloc(1,0x50);
  if (plStack_58 == (lysp_node *)0x0) {
    if (plStack_18 == (lysp_yang_ctx *)0x0) {
      local_b0 = (ly_ctx *)0x0;
    }
    else {
      local_b0 = (ly_ctx *)
                 **(undefined8 **)
                   (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    }
    ly_log(local_b0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_any");
    return LY_EMEM;
  }
  if (*pplStack_30 == (lysp_node *)0x0) {
    *pplStack_30 = plStack_58;
  }
  else {
    plVar1 = *pplStack_30;
    while (plStack_78 = (long *)((long)plVar1 + (long)*pplStack_30 + (0x10 - (long)*pplStack_30)),
          *plStack_78 != 0) {
      plVar1 = (lysp_node *)*plStack_78;
    }
    *plStack_78 = (long)plStack_58;
  }
  uVar2 = 0x20;
  if (parent_local._4_4_ == LY_STMT_ANYDATA) {
    uVar2 = 0x60;
  }
  plStack_58->nodetype = uVar2;
  plStack_58->parent = (lysp_node *)siblings_local;
  LVar3 = get_argument(plStack_18,Y_IDENTIF_ARG,(uint16_t *)0x0,(char **)&word_len,&word,
                       (size_t *)&any);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  if (word == (char *)0x0) {
    if (plStack_18 == (lysp_yang_ctx *)0x0) {
      local_c0 = (ly_ctx *)0x0;
    }
    else {
      local_c0 = (ly_ctx *)
                 **(undefined8 **)
                   (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    }
    if (any == (lysp_node_anydata *)0x0) {
      local_d0 = "";
    }
    else {
      local_d0 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_c0,local_d0,(size_t)any,&plStack_58->name);
  }
  else {
    if (plStack_18 == (lysp_yang_ctx *)0x0) {
      local_b8 = (ly_ctx *)0x0;
    }
    else {
      local_b8 = (ly_ctx *)
                 **(undefined8 **)
                   (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    }
    buf._4_4_ = lydict_insert_zc(local_b8,(char *)word_len,&plStack_58->name);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    buf._4_4_ = get_keyword(plStack_18,(ly_stmt *)((long)&p__ + 4),(char **)&word_len,(size_t *)&any
                           );
    if (buf._4_4_ == LY_SUCCESS) {
      if (p__._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar3 = buf._4_4_;
      }
      else {
        if (p__._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (plStack_18 == (lysp_yang_ctx *)0x0) {
            local_d8 = (ly_ctx *)0x0;
          }
          else {
            local_d8 = (ly_ctx *)
                       **(undefined8 **)
                         (plStack_18->parsed_mods->field_2).dnodes
                         [plStack_18->parsed_mods->count - 1];
          }
          pcVar4 = lyplg_ext_stmt2str(p__._4_4_);
          ly_vlog(local_d8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
          return LY_EVALID;
        }
        LVar3 = get_keyword(plStack_18,(ly_stmt *)((long)&p__ + 4),(char **)&word_len,(size_t *)&any
                           );
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        ret___2._3_1_ = p__._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar3 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar3, !(bool)ret___2._3_1_) {
        if (p__._4_4_ == LY_STMT_CONFIG) {
          LVar3 = parse_config(plStack_18,&plStack_58->flags,&plStack_58->exts);
        }
        else if (p__._4_4_ == LY_STMT_DESCRIPTION) {
          LVar3 = parse_text_field(plStack_18,plStack_58->dsc,LY_STMT_DESCRIPTION,0,&plStack_58->dsc
                                   ,Y_STR_ARG,(uint16_t *)0x0,&plStack_58->exts);
        }
        else if (p__._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
          LVar3 = parse_ext(plStack_18,(char *)word_len,(size_t)any,plStack_58,parent_local._4_4_,0,
                            &plStack_58->exts);
        }
        else if (p__._4_4_ == LY_STMT_IF_FEATURE) {
          LVar3 = parse_qnames(plStack_18,LY_STMT_IF_FEATURE,&plStack_58->iffeatures,Y_STR_ARG,
                               &plStack_58->exts);
        }
        else if (p__._4_4_ == LY_STMT_MANDATORY) {
          LVar3 = parse_mandatory(plStack_18,&plStack_58->flags,&plStack_58->exts);
        }
        else if (p__._4_4_ == LY_STMT_MUST) {
          LVar3 = parse_restrs(plStack_18,LY_STMT_MUST,(lysp_restr **)(plStack_58 + 1));
        }
        else if (p__._4_4_ == LY_STMT_REFERENCE) {
          LVar3 = parse_text_field(plStack_18,plStack_58->ref,LY_STMT_REFERENCE,0,&plStack_58->ref,
                                   Y_STR_ARG,(uint16_t *)0x0,&plStack_58->exts);
        }
        else if (p__._4_4_ == LY_STMT_STATUS) {
          LVar3 = parse_status(plStack_18,&plStack_58->flags,&plStack_58->exts);
        }
        else {
          if (p__._4_4_ != LY_STMT_WHEN) {
            if (plStack_18 == (lysp_yang_ctx *)0x0) {
              local_f0 = (ly_ctx *)0x0;
            }
            else {
              local_f0 = (ly_ctx *)
                         **(undefined8 **)
                           (plStack_18->parsed_mods->field_2).dnodes
                           [plStack_18->parsed_mods->count - 1];
            }
            pcVar4 = lyplg_ext_stmt2str(p__._4_4_);
            pcVar5 = lyplg_ext_stmt2str(parent_local._4_4_);
            ly_vlog(local_f0,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,pcVar5);
            return LY_EVALID;
          }
          LVar3 = parse_when(plStack_18,(lysp_when **)&plStack_58[1].nodetype);
        }
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        buf._4_4_ = get_keyword(plStack_18,(ly_stmt *)((long)&p__ + 4),(char **)&word_len,
                                (size_t *)&any);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar3 = LY_SUCCESS;
        if (p__._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if ((plStack_58->exts != (lysp_ext_instance *)0x0) &&
             (LVar3 = ly_set_add(&plStack_18->main_ctx->ext_inst,plStack_58->exts,'\x01',
                                 (uint32_t *)0x0), LVar3 != LY_SUCCESS)) {
            return LVar3;
          }
          buf._4_4_ = LVar3;
          ret___2._3_1_ = true;
          LVar3 = buf._4_4_;
        }
      }
    }
  }
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_any(struct lysp_yang_ctx *ctx, enum ly_stmt any_kw, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    struct lysp_node_anydata *any;
    enum ly_stmt kw;

    /* create new structure and insert into siblings */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, any, next, LY_EMEM);

    any->nodetype = any_kw == LY_STMT_ANYDATA ? LYS_ANYDATA : LYS_ANYXML;
    any->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, any->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &any->flags, &any->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, any->dsc, LY_STMT_DESCRIPTION, 0, &any->dsc, Y_STR_ARG, NULL, &any->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &any->iffeatures, Y_STR_ARG, &any->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(parse_mandatory(ctx, &any->flags, &any->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &any->musts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, any->ref, LY_STMT_REFERENCE, 0, &any->ref, Y_STR_ARG, NULL, &any->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &any->flags, &any->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &any->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, any, any_kw, 0, &any->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(any_kw));
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, any->exts, ret, cleanup);
    }

cleanup:
    return ret;
}